

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

MPP_RET read_with_pixel_width
                  (RK_U8 *buf,RK_S32 width,RK_S32 height,RK_S32 hor_stride,RK_S32 pix_w,FILE *fp)

{
  int iVar1;
  size_t sVar2;
  MPP_RET local_30;
  RK_S32 read_size;
  MPP_RET ret;
  RK_S32 row;
  FILE *fp_local;
  RK_S32 pix_w_local;
  RK_S32 hor_stride_local;
  RK_S32 height_local;
  RK_S32 width_local;
  RK_U8 *buf_local;
  
  local_30 = MPP_OK;
  fp_local._4_4_ = hor_stride;
  if (hor_stride < width * pix_w) {
    _mpp_log_l(2,"utils",
               "invalid %dbit color config: hor_stride %d is smaller then width %d multiply by 4\n",
               "read_with_pixel_width",pix_w << 3,hor_stride,width,pix_w);
    _mpp_log_l(2,"utils","width  should be defined by pixel count\n","read_with_pixel_width");
    _mpp_log_l(2,"utils","stride should be defined by byte count\n","read_with_pixel_width");
    fp_local._4_4_ = width * pix_w;
  }
  read_size = 0;
  while( true ) {
    if (height <= read_size) {
      return local_30;
    }
    sVar2 = fread(buf + read_size * fp_local._4_4_,1,(long)(width * pix_w),(FILE *)fp);
    iVar1 = feof((FILE *)fp);
    if (iVar1 != 0) break;
    if ((int)sVar2 != width * pix_w) {
      _mpp_log_l(2,"utils","read file failed expect %d vs %d\n","read_with_pixel_width",
                 width * pix_w,sVar2 & 0xffffffff);
      local_30 = MPP_NOK;
    }
    read_size = read_size + 1;
  }
  return MPP_NOK;
}

Assistant:

static MPP_RET read_with_pixel_width(RK_U8 *buf, RK_S32 width, RK_S32 height,
                                     RK_S32 hor_stride, RK_S32 pix_w, FILE *fp)
{
    RK_S32 row;
    MPP_RET ret = MPP_OK;

    if (hor_stride < width * pix_w) {
        mpp_err_f("invalid %dbit color config: hor_stride %d is smaller then width %d multiply by 4\n",
                  8 * pix_w, hor_stride, width, pix_w);
        mpp_err_f("width  should be defined by pixel count\n");
        mpp_err_f("stride should be defined by byte count\n");

        hor_stride = width * pix_w;
    }

    for (row = 0; row < height; row++) {
        RK_S32 read_size = fread(buf + row * hor_stride, 1, width * pix_w, fp);
        if (feof(fp)) {
            ret = MPP_NOK;
            break;
        }
        if (read_size != width * pix_w) {
            mpp_err_f("read file failed expect %d vs %d\n",
                      width * pix_w, read_size);
            ret = MPP_NOK;
        }
    }

    return ret;
}